

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTst<(moira::Instr)127,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 data;
  u32 ea;
  byte local_10 [4];
  u32 local_c;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)1,0ul>(this,opcode & 7,&local_c,(u32 *)local_10);
  if (bVar1) {
    (this->reg).sr.n = (bool)(local_10[0] >> 7);
    (this->reg).sr.z = local_10[0] == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    prefetch<4ul>(this);
  }
  return;
}

Assistant:

void
Moira::execTst(u16 opcode)
{
    int rg = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(rg, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}